

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_partition.h
# Opt level: O1

size_t embree::
       parallel_partitioning<unsigned_int,unsigned_long,int,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__0,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__1,parallel_partition_unit_test::____C_A_T_C_H____T_E_S_T____12()::__2>
                 (uint *array,size_t begin,size_t end,int *identity,unsigned_long *leftReduction,
                 unsigned_long *rightReduction,anon_class_8_1_a8a30a3a *is_left,
                 anon_class_1_0_00000001 *reduction_t,anon_class_1_0_00000001 *reduction_v,
                 size_t BLOCK_SIZE)

{
  size_t sVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  _Head_base<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_false>
  _Var5;
  task *ptVar6;
  ulong uVar7;
  uint *puVar8;
  uint *puVar9;
  runtime_error *prVar10;
  _func_int **pp_Var11;
  ulong uVar12;
  long lVar13;
  _func_int **pp_Var14;
  size_t sVar15;
  uint *puVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  size_t numMisplacedItemsLeft;
  small_object_allocator alloc;
  task_group_context context;
  long local_128;
  long local_120;
  anon_class_8_1_a8a30a3a local_118;
  task_traits local_110;
  __uniq_ptr_impl<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
  local_108;
  _Head_base<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_false>
  local_100;
  int *local_f8;
  undefined1 local_f0 [56];
  undefined8 local_b8;
  task_group_context local_b0;
  
  if (begin < 0x80) {
    puVar8 = array + begin;
    puVar16 = array;
    while( true ) {
      puVar9 = puVar8 + -1;
      for (; (puVar16 <= puVar9 && ((ulong)*puVar16 < *(ulong *)*rightReduction));
          puVar16 = puVar16 + 1) {
        *(ulong *)identity = *(long *)identity + (ulong)*puVar16;
      }
      if (puVar9 < puVar16) break;
      uVar7 = (ulong)*puVar9;
      if (*(ulong *)*rightReduction <= uVar7) {
        puVar8 = puVar8 + -2;
        do {
          puVar9 = puVar8;
          *leftReduction = *leftReduction + uVar7;
          if (puVar9 < puVar16) goto LAB_0015d625;
          uVar7 = (ulong)*puVar9;
          puVar8 = puVar9 + -1;
        } while (*(ulong *)*rightReduction <= uVar7);
      }
      puVar8 = puVar9;
      if (puVar8 < puVar16) break;
      *(ulong *)identity = *(long *)identity + (ulong)*puVar8;
      *leftReduction = *leftReduction + (ulong)*puVar16;
      uVar3 = *puVar16;
      *puVar16 = *puVar8;
      *puVar8 = uVar3;
      puVar16 = puVar16 + 1;
    }
LAB_0015d625:
    sVar15 = (long)puVar16 - (long)array >> 2;
  }
  else {
    local_f8 = (int *)end;
    _Var5._M_head_impl =
         (parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>
          *)alignedMalloc(0x10c0,0x40);
    (_Var5._M_head_impl)->array = array;
    (_Var5._M_head_impl)->N = begin;
    (_Var5._M_head_impl)->is_left = (anon_class_8_1_a8a30a3a *)rightReduction;
    (_Var5._M_head_impl)->reduction_t = (anon_class_1_0_00000001 *)is_left;
    (_Var5._M_head_impl)->reduction_v = reduction_t;
    (_Var5._M_head_impl)->identity = local_f8;
    uVar3 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    pp_Var14 = (_func_int **)(begin + 0x7f >> 7);
    pp_Var11 = (_func_int **)0x40;
    if (uVar3 < 0x40) {
      pp_Var11 = (_func_int **)(ulong)uVar3;
    }
    if (pp_Var11 <= pp_Var14) {
      pp_Var14 = pp_Var11;
    }
    (_Var5._M_head_impl)->numTasks = (size_t)pp_Var14;
    local_b0.my_version = proxy_support;
    local_b0.my_traits = (context_traits)0x4;
    local_b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_b0.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_b0.my_name = 8;
    local_108._M_t.
    super__Tuple_impl<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
    .
    super__Head_base<0UL,_embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_false>
    ._M_head_impl =
         (tuple<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
          )(tuple<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_*,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
            )_Var5._M_head_impl;
    local_100._M_head_impl = _Var5._M_head_impl;
    tbb::detail::r1::initialize((task_group_context *)(local_f0 + 0x40));
    local_110.m_version_and_traits = (uint64_t)&local_100;
    if (pp_Var14 != (_func_int **)0x0) {
      local_f0._0_8_ = (small_object_pool *)0x0;
      ptVar6 = (task *)tbb::detail::r1::allocate((small_object_pool **)local_f0,0xc0);
      ptVar6->m_reserved[3] = 0;
      ptVar6->m_reserved[4] = 0;
      ptVar6->m_reserved[1] = 0;
      ptVar6->m_reserved[2] = 0;
      (ptVar6->super_task_traits).m_version_and_traits = 0;
      ptVar6->m_reserved[0] = 0;
      ptVar6->m_reserved[5] = 0;
      ptVar6->_vptr_task = (_func_int **)&PTR__task_001990d0;
      ptVar6[1]._vptr_task = pp_Var14;
      ptVar6[1].super_task_traits.m_version_and_traits = 0;
      ptVar6[1].m_reserved[0] = 1;
      ptVar6[1].m_reserved[1] = (uint64_t)&local_110;
      ptVar6[1].m_reserved[2] = 0;
      ptVar6[1].m_reserved[3] = 1;
      iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      *(undefined4 *)&ptVar6[2]._vptr_task = 0;
      *(undefined1 *)((long)&ptVar6[2]._vptr_task + 4) = 5;
      ptVar6[1].m_reserved[5] = ((long)iVar4 & 0x3fffffffffffffffU) * 2;
      ptVar6[2].super_task_traits.m_version_and_traits = local_f0._0_8_;
      local_f0._32_8_ = (anon_class_1_0_00000001 *)0x0;
      local_f0._40_4_ = 1;
      local_f0._48_8_ = 1;
      local_b8 = 1;
      ptVar6[1].m_reserved[4] = (uint64_t)(local_f0 + 0x20);
      tbb::detail::r1::execute_and_wait
                (ptVar6,(task_group_context *)(local_f0 + 0x40),(wait_context *)(local_f0 + 0x30),
                 (task_group_context *)(local_f0 + 0x40));
    }
    cVar2 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)(local_f0 + 0x40));
    if (cVar2 != '\0') {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar10,"task cancelled");
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)(local_f0 + 0x40));
    (_Var5._M_head_impl)->counter_start[(_Var5._M_head_impl)->numTasks] = (_Var5._M_head_impl)->N;
    (_Var5._M_head_impl)->counter_left[(_Var5._M_head_impl)->numTasks] = 0;
    uVar7 = (_Var5._M_head_impl)->numTasks;
    if (uVar7 != 0) {
      uVar12 = 0;
      do {
        *(unsigned_long *)identity =
             *(long *)identity + (_Var5._M_head_impl)->leftReductions[uVar12];
        *leftReduction = *leftReduction + (_Var5._M_head_impl)->rightReductions[uVar12];
        uVar12 = uVar12 + 1;
        uVar7 = (_Var5._M_head_impl)->numTasks;
      } while (uVar12 < uVar7);
    }
    sVar15 = (_Var5._M_head_impl)->counter_left[0];
    if (1 < uVar7) {
      lVar13 = 0;
      do {
        sVar15 = sVar15 + (_Var5._M_head_impl)->counter_left[lVar13 + 1];
        lVar13 = lVar13 + 1;
      } while (uVar7 - 1 != lVar13);
    }
    sVar1 = (_Var5._M_head_impl)->N;
    local_118.split = (uint64_t *)0x0;
    local_120 = 0;
    local_128 = 0;
    pp_Var14 = (_func_int **)(_Var5._M_head_impl)->numTasks;
    if (pp_Var14 != (_func_int **)0x0) {
      pp_Var11 = (_func_int **)0x0;
      do {
        sVar17 = (_Var5._M_head_impl)->counter_start[(long)pp_Var11];
        sVar18 = (_Var5._M_head_impl)->counter_left[(long)pp_Var11] + sVar17;
        sVar19 = 0;
        if (0 < (long)sVar18) {
          sVar19 = sVar18;
        }
        sVar20 = (_Var5._M_head_impl)->counter_start[(long)pp_Var11 + 1];
        if ((long)sVar15 < (long)(_Var5._M_head_impl)->counter_start[(long)pp_Var11 + 1]) {
          sVar20 = sVar15;
        }
        if ((long)sVar17 < (long)sVar15) {
          sVar17 = sVar15;
        }
        if ((long)sVar1 < (long)sVar18) {
          sVar18 = sVar1;
        }
        if (sVar20 - sVar19 != 0 && (long)sVar19 <= (long)sVar20) {
          local_128 = local_128 + (sVar20 - sVar19);
          (_Var5._M_head_impl)->leftMisplacedRanges[(long)local_118.split]._begin = sVar19;
          (_Var5._M_head_impl)->leftMisplacedRanges[(long)local_118.split]._end = sVar20;
          local_118.split = local_118.split + 1;
        }
        if ((long)sVar17 < (long)sVar18) {
          (_Var5._M_head_impl)->rightMisplacedRanges[local_120]._begin = sVar17;
          (_Var5._M_head_impl)->rightMisplacedRanges[local_120]._end = sVar18;
          local_120 = local_120 + 1;
        }
        pp_Var11 = (_func_int **)((long)pp_Var11 + 1);
        pp_Var14 = (_func_int **)(_Var5._M_head_impl)->numTasks;
      } while (pp_Var11 < pp_Var14);
    }
    if (local_128 != 0) {
      local_f0._16_8_ = &local_118;
      local_f0._24_8_ = &local_120;
      local_b0.my_version = proxy_support;
      local_b0.my_traits = (context_traits)0x4;
      local_b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
      local_b0.my_node.my_next_node = (intrusive_list_node *)0x0;
      local_b0.my_name = 8;
      local_f0._0_8_ = (small_object_pool *)&local_128;
      local_f0._8_8_ = _Var5._M_head_impl;
      tbb::detail::r1::initialize((task_group_context *)(local_f0 + 0x40));
      local_100._M_head_impl =
           (parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>
            *)local_f0;
      if (pp_Var14 != (_func_int **)0x0) {
        local_110.m_version_and_traits = 0;
        ptVar6 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_110,0xc0);
        ptVar6->m_reserved[3] = 0;
        ptVar6->m_reserved[4] = 0;
        ptVar6->m_reserved[1] = 0;
        ptVar6->m_reserved[2] = 0;
        (ptVar6->super_task_traits).m_version_and_traits = 0;
        ptVar6->m_reserved[0] = 0;
        ptVar6->m_reserved[5] = 0;
        ptVar6->_vptr_task = (_func_int **)&PTR__task_00199118;
        ptVar6[1]._vptr_task = pp_Var14;
        ptVar6[1].super_task_traits.m_version_and_traits = 0;
        ptVar6[1].m_reserved[0] = 1;
        ptVar6[1].m_reserved[1] = (uint64_t)&local_100;
        ptVar6[1].m_reserved[2] = 0;
        ptVar6[1].m_reserved[3] = 1;
        iVar4 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
        *(undefined4 *)&ptVar6[2]._vptr_task = 0;
        *(undefined1 *)((long)&ptVar6[2]._vptr_task + 4) = 5;
        ptVar6[1].m_reserved[5] = ((long)iVar4 & 0x3fffffffffffffffU) * 2;
        ptVar6[2].super_task_traits.m_version_and_traits = local_110.m_version_and_traits;
        local_f0._32_8_ = (anon_class_1_0_00000001 *)0x0;
        local_f0._40_4_ = 1;
        local_f0._48_8_ = 1;
        local_b8 = 1;
        ptVar6[1].m_reserved[4] = (uint64_t)(local_f0 + 0x20);
        tbb::detail::r1::execute_and_wait
                  (ptVar6,(task_group_context *)(local_f0 + 0x40),(wait_context *)(local_f0 + 0x30),
                   (task_group_context *)(local_f0 + 0x40));
      }
      cVar2 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)(local_f0 + 0x40))
      ;
      if (cVar2 != '\0') {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar10,"task cancelled");
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)(local_f0 + 0x40));
    }
    std::
    unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:27:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:28:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:27:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:28:40),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/embree_tests/common/algorithms/parallel_partition.cpp:29:40)>_>_>
    ::~unique_ptr((unique_ptr<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>,_std::default_delete<embree::parallel_partition_task<unsigned_int,_unsigned_long,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:27:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:28:40),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_embree_tests_common_algorithms_parallel_partition_cpp:29:40)>_>_>
                   *)&local_108);
  }
  return sVar15;
}

Assistant:

__noinline size_t parallel_partitioning(T* array, 
                                            const size_t begin,
                                            const size_t end, 
                                            const Vi &identity,
                                            V &leftReduction,
                                            V &rightReduction,
                                            const IsLeft& is_left, 
                                            const Reduction_T& reduction_t,
                                            const Reduction_V& reduction_v,
                                            size_t BLOCK_SIZE = 128)
  {
    /* fall back to single threaded partitioning for small N */
    if (unlikely(end-begin < BLOCK_SIZE))
      return serial_partitioning(array,begin,end,leftReduction,rightReduction,is_left,reduction_t);

    /* otherwise use parallel code */
    else {
      typedef parallel_partition_task<T,V,Vi,IsLeft,Reduction_T,Reduction_V> partition_task;
      std::unique_ptr<partition_task> p(new partition_task(&array[begin],end-begin,identity,is_left,reduction_t,reduction_v,BLOCK_SIZE));
      return begin+p->partition(leftReduction,rightReduction);    
    }
  }